

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

void __thiscall
prometheus::Gateway::Gateway
          (Gateway *this,string *host,string *port,string *jobname,Labels *labels,string *username,
          string *password,seconds timeout)

{
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  rep local_a8;
  string *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0 = 0;
  local_b8 = 0;
  local_a8 = timeout.__r;
  local_c8 = &local_b8;
  local_a0 = jobname;
  if (username->_M_string_length != 0) {
    ::std::operator+(&local_70,username,":");
    ::std::operator+(&local_50,&local_70,password);
    ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x28);
  *(code **)local_98._M_unused._0_8_ = (code *)((long)local_98._M_unused._0_8_ + 0x10);
  if (local_c8 == &local_b8) {
    *(ulong *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_b7,local_b8);
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_b0;
  }
  else {
    *(undefined1 **)local_98._M_unused._0_8_ = local_c8;
    *(ulong *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_b7,local_b8);
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_c0;
  local_c0 = 0;
  local_b8 = 0;
  *(rep *)((long)local_98._M_unused._0_8_ + 0x20) = local_a8;
  pcStack_80 = ::std::
               _Function_handler<void_(void_*),_prometheus::(anonymous_namespace)::SetupAdapter>::
               _M_invoke;
  local_88 = ::std::
             _Function_handler<void_(void_*),_prometheus::(anonymous_namespace)::SetupAdapter>::
             _M_manager;
  local_c8 = &local_b8;
  Gateway(this,host,port,(function<void_(void_*)> *)&local_98,local_a0,labels);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

Gateway::Gateway(const std::string& host, const std::string& port,
                 const std::string& jobname, const Labels& labels,
                 const std::string& username, const std::string& password,
                 std::chrono::seconds timeout)
    : Gateway(host, port, SetupAdapter{username, password, timeout}, jobname,
              labels) {}